

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

VisitReturn __thiscall
QMakeEvaluator::evaluateFunction
          (QMakeEvaluator *this,ProFunctionDef *func,QList<ProStringList> *argumentsList,
          ProStringList *ret)

{
  QStack<QMakeEvaluator::Location> *this_00;
  ProValueMapStack *__position;
  qsizetype *pqVar1;
  ushort uVar2;
  int iVar3;
  ProString *pPVar4;
  _List_node_base *p_Var5;
  ProFile *pPVar6;
  Data *pDVar7;
  qsizetype qVar8;
  VisitReturn VVar9;
  QArrayDataPointer<ProString> *pQVar10;
  ProStringList *pPVar11;
  iterator iVar12;
  char16_t *pcVar13;
  VisitReturn VVar14;
  ulong uVar15;
  long lVar16;
  long in_FS_OFFSET;
  QByteArrayView QVar17;
  type r;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  local_e8;
  QString local_e0;
  QArrayDataPointer<ProString> local_c8;
  ProString local_a8;
  QArrayDataPointer<ProString> local_78;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_valuemapStack).
      super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      _M_impl._M_node._M_size < 100) {
    __position = &this->m_valuemapStack;
    local_a8.m_string.d.d = (Data *)0x0;
    std::__cxx11::list<QMap<ProKey,ProStringList>,std::allocator<QMap<ProKey,ProStringList>>>::
    _M_insert<QMap<ProKey,ProStringList>const&>
              ((list<QMap<ProKey,ProStringList>,std::allocator<QMap<ProKey,ProStringList>>> *)
               __position,(iterator)__position,(QMap<ProKey,_ProStringList> *)&local_a8);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                *)&local_a8);
    this_00 = &this->m_locationStack;
    QtPrivate::QPodArrayOps<QMakeEvaluator::Location>::emplace<QMakeEvaluator::Location_const&>
              ((QPodArrayOps<QMakeEvaluator::Location> *)this_00,
               (this->m_locationStack).super_QList<QMakeEvaluator::Location>.d.size,&this->m_current
              );
    QList<QMakeEvaluator::Location>::end(&this_00->super_QList<QMakeEvaluator::Location>);
    local_78.size = 0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (ProString *)0x0;
    if ((argumentsList->d).size != 0) {
      lVar16 = 0;
      uVar15 = 0;
      do {
        pPVar11 = (argumentsList->d).ptr;
        pPVar4 = *(ProString **)((long)&(pPVar11->super_QList<ProString>).d.ptr + lVar16);
        QtPrivate::QCommonArrayOps<ProString>::growAppend
                  ((QCommonArrayOps<ProString> *)&local_78,pPVar4,
                   pPVar4 + *(long *)((long)&(pPVar11->super_QList<ProString>).d.size + lVar16));
        pPVar11 = (argumentsList->d).ptr;
        p_Var5 = (this->m_valuemapStack).
                 super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                 .
                 super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
        uVar15 = uVar15 + 1;
        QString::number((int)&local_58,(int)uVar15);
        ProKey::ProKey((ProKey *)&local_a8,(QString *)&local_58);
        pQVar10 = (QArrayDataPointer<ProString> *)
                  QMap<ProKey,_ProStringList>::operator[]
                            ((QMap<ProKey,_ProStringList> *)(p_Var5 + 1),(ProKey *)&local_a8);
        QArrayDataPointer<ProString>::operator=
                  (pQVar10,(QArrayDataPointer<ProString> *)
                           ((long)&(pPVar11->super_QList<ProString>).d.d + lVar16));
        if (&(local_a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
          }
        }
        lVar16 = lVar16 + 0x18;
      } while (uVar15 < (ulong)(argumentsList->d).size);
    }
    pQVar10 = (QArrayDataPointer<ProString> *)
              QMap<ProKey,_ProStringList>::operator[]
                        ((QMap<ProKey,_ProStringList> *)
                         ((this->m_valuemapStack).
                          super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                          .
                          super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                          ._M_impl._M_node.super__List_node_base._M_prev + 1),
                         (ProKey *)(QMakeInternal::statics + 0x78));
    QArrayDataPointer<ProString>::operator=(pQVar10,&local_78);
    QString::number((longlong)&local_e0,(int)(argumentsList->d).size);
    ProString::ProString(&local_a8,&local_e0);
    local_c8.size = 0;
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (ProString *)0x0;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)&local_c8,0,&local_a8);
    QList<ProString>::end((QList<ProString> *)&local_c8);
    pPVar11 = QMap<ProKey,_ProStringList>::operator[]
                        ((QMap<ProKey,_ProStringList> *)
                         ((this->m_valuemapStack).
                          super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                          .
                          super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                          ._M_impl._M_node.super__List_node_base._M_prev + 1),
                         (ProKey *)(QMakeInternal::statics + 0xa8));
    qVar8 = local_c8.size;
    pPVar4 = local_c8.ptr;
    pDVar7 = local_c8.d;
    local_c8.size = 0;
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (ProString *)0x0;
    local_58.d = (pPVar11->super_QList<ProString>).d.d;
    local_58.ptr = (pPVar11->super_QList<ProString>).d.ptr;
    (pPVar11->super_QList<ProString>).d.d = pDVar7;
    (pPVar11->super_QList<ProString>).d.ptr = pPVar4;
    local_58.size = (pPVar11->super_QList<ProString>).d.size;
    (pPVar11->super_QList<ProString>).d.size = qVar8;
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_c8);
    if (&(local_a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,0x10);
      }
    }
    pcVar13 = (func->m_pro->m_proitems).d.ptr;
    if (pcVar13 == (char16_t *)0x0) {
      pcVar13 = (char16_t *)&QString::_empty;
    }
    iVar3 = func->m_offset;
    (this->m_current).pro = func->m_pro;
    (this->m_current).line = 0;
    VVar9 = visitProBlock(this,(ushort *)(pcVar13 + iVar3));
    VVar14 = ReturnTrue;
    if (VVar9 != ReturnReturn) {
      VVar14 = VVar9;
    }
    if (VVar14 == ReturnTrue) {
      QArrayDataPointer<ProString>::operator=
                ((QArrayDataPointer<ProString> *)ret,
                 (QArrayDataPointer<ProString> *)&this->m_returnValue);
    }
    QList<ProString>::clear(&(this->m_returnValue).super_QList<ProString>);
    iVar12 = QList<QMakeEvaluator::Location>::end(&this_00->super_QList<QMakeEvaluator::Location>);
    pPVar6 = iVar12.i[-1].pro;
    uVar2 = iVar12.i[-1].line;
    pqVar1 = &(this->m_locationStack).super_QList<QMakeEvaluator::Location>.d.size;
    *pqVar1 = *pqVar1 + -1;
    (this->m_current).pro = pPVar6;
    (this->m_current).line = uVar2;
    p_Var5 = (this->m_valuemapStack).
             super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
             super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    local_e8.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )p_Var5[1]._M_next;
    p_Var5[1]._M_next = (_List_node_base *)0x0;
    std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
    _M_erase(&__position->
              super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
             ,(this->m_valuemapStack).
              super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
              .
              super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
              ._M_impl._M_node.super__List_node_base._M_prev);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_e8);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_78);
  }
  else {
    QVar17.m_data = (storage_type *)0x2a;
    QVar17.m_size = (qsizetype)&local_a8;
    QString::fromLatin1(QVar17);
    message(this,0x310,&local_a8.m_string);
    if (&(local_a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    VVar14 = ReturnError;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar14;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateFunction(
        const ProFunctionDef &func, const QList<ProStringList> &argumentsList, ProStringList *ret)
{
    VisitReturn vr;

    if (m_valuemapStack.size() >= 100) {
        evalError(fL1S("Ran into infinite recursion (depth > 100)."));
        vr = ReturnError;
    } else {
        m_valuemapStack.push(ProValueMap());
        m_locationStack.push(m_current);

        ProStringList args;
        for (int i = 0; i < argumentsList.size(); ++i) {
            args += argumentsList[i];
            m_valuemapStack.top()[ProKey(QString::number(i+1))] = argumentsList[i];
        }
        m_valuemapStack.top()[statics.strARGS] = args;
        m_valuemapStack.top()[statics.strARGC] = ProStringList(ProString(QString::number(argumentsList.size())));
        vr = visitProBlock(func.pro(), func.tokPtr());
        if (vr == ReturnReturn)
            vr = ReturnTrue;
        if (vr == ReturnTrue)
            *ret = m_returnValue;
        m_returnValue.clear();

        m_current = m_locationStack.pop();
        m_valuemapStack.pop();
    }
    return vr;
}